

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.cpp
# Opt level: O2

ostream * cali::operator<<(ostream *os,Attribute *a)

{
  int prop;
  cali_attr_type type;
  ostream *poVar1;
  char *pcVar2;
  string sStack_138;
  char buf [256];
  
  prop = Attribute::properties(a);
  cali_prop2string(prop,buf,0x100);
  poVar1 = std::operator<<(os,"{ \"id\" : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", \"name\" : \"");
  Attribute::name_abi_cxx11_(&sStack_138,a);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_138);
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1,", \"type\" : \"");
  type = Attribute::type(a);
  pcVar2 = cali_type2string(type);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1,", \"properties\" : \"");
  poVar1 = std::operator<<(poVar1,buf);
  poVar1 = std::operator<<(poVar1,"\" }");
  std::__cxx11::string::~string((string *)&sStack_138);
  return poVar1;
}

Assistant:

std::ostream& cali::operator<< (std::ostream& os, const Attribute& a)
{
    char buf[256];

    cali_prop2string(a.properties(), buf, 256);

    return os << "{ \"id\" : " << a.id() << ", \"name\" : \"" << a.name() << "\""
              << ", \"type\" : \"" << cali_type2string(a.type()) << "\""
              << ", \"properties\" : \"" << buf << "\" }";
}